

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetCurrentNetwork(Registry *this,Network *aRet)

{
  Status SVar1;
  int iVar2;
  NetworkId networkId;
  Network local_78;
  
  if (this->mStorage == (PersistentStorage *)0x0) {
    __assert_fail("mStorage != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry.cpp"
                  ,0x23c,
                  "Registry::Status ot::commissioner::persistent_storage::Registry::GetCurrentNetwork(Network &)"
                 );
  }
  NetworkId::NetworkId(&networkId);
  iVar2 = (*this->mStorage->_vptr_PersistentStorage[0x1d])(this->mStorage,&networkId);
  SVar1 = kError;
  if ((char)iVar2 == '\0') {
    if (networkId.mId == 0xffffffff) {
      Network::Network(&local_78);
      Network::operator=(aRet,&local_78);
      Network::~Network(&local_78);
      SVar1 = kSuccess;
    }
    else {
      iVar2 = (*this->mStorage->_vptr_PersistentStorage[0xe])(this->mStorage,&networkId,aRet);
      SVar1 = kNotFound;
      if ((char)iVar2 != '\x01') {
        SVar1 = ((char)iVar2 != '\0') << 2;
      }
    }
  }
  return SVar1;
}

Assistant:

Registry::Status Registry::GetCurrentNetwork(Network &aRet)
{
    assert(mStorage != nullptr);
    NetworkId networkId;
    if (MapStatus(mStorage->GetCurrentNetwork(networkId)) != Registry::Status::kSuccess)
    {
        return Registry::Status::kError;
    }

    return (networkId.mId == EMPTY_ID) ? (aRet = Network{}, Registry::Status::kSuccess)
                                       : MapStatus(mStorage->Get(networkId, aRet));
}